

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void highbd_dc_left_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < bh) {
    uVar4 = (ulong)(uint)bh;
  }
  iVar1 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + (uint)above[uVar3];
  }
  for (iVar2 = 0; iVar2 != (int)uVar4; iVar2 = iVar2 + 1) {
    for (uVar3 = 0; (uint)bw != uVar3; uVar3 = uVar3 + 1) {
      dst[uVar3] = (uint16_t)((int)(iVar1 + ((uint)bh >> 1)) / bh);
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_dc_left_predictor(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)above;
  (void)bd;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}